

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>>::
find<0ul,char_const(&)[4]>
          (Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>> *this,
          char (*params) [7])

{
  Maybe<kj::StringPtr_&> MVar1;
  ArrayPtr<kj::StringPtr> table;
  TreeIndex<kj::_::(anonymous_namespace)::StringCompare> local_28 [8];
  long local_20;
  
  table.ptr = params[4] + 4;
  table.size_ = *(size_t *)params;
  TreeIndex<kj::_::(anonymous_namespace)::StringCompare>::find<kj::StringPtr,char_const(&)[4]>
            (local_28,table,
             (char (*) [7])((long)(*(long *)(params[1] + 1) - *(size_t *)params) >> 4));
  if (local_28[0] == (TreeIndex<kj::_::(anonymous_namespace)::StringCompare>)0x1) {
    MVar1.ptr = (StringPtr *)(local_20 * 0x10 + *(long *)params);
  }
  else {
    MVar1.ptr = (StringPtr *)0x0;
  }
  *(StringPtr **)this = MVar1.ptr;
  return (Maybe<kj::StringPtr_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}